

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

void __thiscall soplex::UpdateVector<double>::update(UpdateVector<double> *this)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((this->thedelta).setupStatus == true) {
    lVar5 = (long)(this->thedelta).super_IdxSet.num;
    if (0 < lVar5) {
      piVar2 = (this->thedelta).super_IdxSet.idx;
      pdVar3 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = (this->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = lVar5 + 1;
      do {
        iVar1 = piVar2[uVar6 - 2];
        pdVar3[iVar1] = this->theval * pdVar4[iVar1] + pdVar3[iVar1];
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
  }
  else {
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar7 = (uint)((ulong)((long)(this->super_VectorBase<double>).val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
    if (0 < (int)uVar7) {
      pdVar4 = (this->thedelta).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar6 = (ulong)(uVar7 & 0x7fffffff) + 1;
      do {
        pdVar3[uVar6 + 0xfffffffffffffffe] =
             this->theval * pdVar4[uVar6 - 2] + pdVar3[uVar6 + 0xfffffffffffffffe];
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
  }
  return;
}

Assistant:

inline
VectorBase<R>& VectorBase<R>::multAdd(const S& x, const SSVectorBase<T>& vec)
{
   assert(vec.dim() <= dim());

   if(vec.isSetup())
   {
      const int* idx = vec.indexMem();

      for(int i = vec.size() - 1; i >= 0; --i)
         val[idx[i]] += x * vec[idx[i]];
   }
   else
   {
      assert(vec.dim() == dim());

      for(int i = dim() - 1; i >= 0; --i)
         val[i] += x * vec.val[i];
   }

   return *this;
}